

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

void __thiscall Reader::processconsec(Reader *this)

{
  LpSectionKeyword LVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  pointer pPVar5;
  element_type *peVar6;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 *paVar7;
  LpComparisonType dir;
  shared_ptr<Constraint> con;
  iterator *end;
  iterator *begin;
  undefined1 in_stack_00000307;
  shared_ptr<Expression> *in_stack_00000308;
  iterator *in_stack_00000310;
  Reader *in_stack_00000318;
  iterator in_stack_00000320;
  Constraint *in_stack_ffffffffffffff18;
  anon_union_8_5_ebd6940d_for_ProcessedToken_1 in_stack_ffffffffffffff20;
  value_type *in_stack_ffffffffffffff28;
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *in_stack_ffffffffffffff30;
  Constraint *in_stack_ffffffffffffff40;
  mapped_type *in_stack_ffffffffffffff58;
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *in_stack_ffffffffffffff60;
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  *this_00;
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  local_40;
  undefined4 local_c;
  
  local_c = 3;
  sVar3 = std::
          map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
          ::count(in_stack_ffffffffffffff30,(key_type *)in_stack_ffffffffffffff28);
  if (sVar3 != 0) {
    local_40._M_t._M_impl.super__Rb_tree_header._M_header._M_right._4_4_ = 3;
    local_40._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
                 ::operator[](in_stack_ffffffffffffff60,(key_type *)in_stack_ffffffffffffff58);
    local_40._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 3;
    pmVar4 = std::
             map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
             ::operator[](in_stack_ffffffffffffff60,(key_type *)in_stack_ffffffffffffff58);
    local_40._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&pmVar4->second;
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                               *)in_stack_ffffffffffffff20.name,
                              (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                               *)in_stack_ffffffffffffff18), bVar2) {
      operator_new(0x20);
      Constraint::Constraint(in_stack_ffffffffffffff40);
      this_00 = &local_40;
      std::shared_ptr<Constraint>::shared_ptr<Constraint,void>
                ((shared_ptr<Constraint> *)in_stack_ffffffffffffff20.name,in_stack_ffffffffffffff18)
      ;
      std::__shared_ptr_access<Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x41ece6);
      std::shared_ptr<Expression>::shared_ptr
                ((shared_ptr<Expression> *)in_stack_ffffffffffffff20.name,
                 (shared_ptr<Expression> *)in_stack_ffffffffffffff18);
      parseexpression(in_stack_00000318,in_stack_00000310,in_stack_00000320,in_stack_00000308,
                      (bool)in_stack_00000307);
      std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)0x41ed2d);
      in_stack_ffffffffffffff58 =
           std::
           map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
           ::operator[](this_00,(key_type *)in_stack_ffffffffffffff58);
      __gnu_cxx::operator!=
                ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                  *)in_stack_ffffffffffffff20.name,
                 (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                  *)in_stack_ffffffffffffff18);
      lpassert(SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0));
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator->((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                    *)local_40._M_t._M_impl.super__Rb_tree_header._M_node_count);
      lpassert(SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0));
      pPVar5 = __gnu_cxx::
               __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
               ::operator->((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                             *)local_40._M_t._M_impl.super__Rb_tree_header._M_node_count);
      LVar1 = (pPVar5->field_1).keyword;
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                    *)local_40._M_t._M_impl.super__Rb_tree_header._M_node_count);
      in_stack_ffffffffffffff40 =
           (Constraint *)local_40._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
      ::operator[](this_00,(key_type *)in_stack_ffffffffffffff58);
      __gnu_cxx::operator!=
                ((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                  *)in_stack_ffffffffffffff20.name,
                 (__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                  *)in_stack_ffffffffffffff18);
      lpassert(SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0));
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator->((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                    *)local_40._M_t._M_impl.super__Rb_tree_header._M_node_count);
      lpassert(SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0));
      if (LVar1 == NONE) {
        pPVar5 = __gnu_cxx::
                 __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                 ::operator->((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                               *)local_40._M_t._M_impl.super__Rb_tree_header._M_node_count);
        in_stack_ffffffffffffff28 = (value_type *)(pPVar5->field_1).name;
        peVar6 = std::__shared_ptr_access<Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x41ef29);
        peVar6->upperbound = (double)in_stack_ffffffffffffff28;
      }
      else if (LVar1 == OBJMAX) {
        pPVar5 = __gnu_cxx::
                 __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                 ::operator->((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                               *)local_40._M_t._M_impl.super__Rb_tree_header._M_node_count);
        in_stack_ffffffffffffff30 =
             (map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
              *)(pPVar5->field_1).name;
        peVar6 = std::__shared_ptr_access<Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x41eee0);
        peVar6->upperbound = (double)in_stack_ffffffffffffff30;
        peVar6 = std::__shared_ptr_access<Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x41eef8);
        peVar6->lowerbound = (double)in_stack_ffffffffffffff30;
      }
      else if (LVar1 == BOUNDS) {
        pPVar5 = __gnu_cxx::
                 __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                 ::operator->((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                               *)local_40._M_t._M_impl.super__Rb_tree_header._M_node_count);
        in_stack_ffffffffffffff20 = pPVar5->field_1;
        paVar7 = (anon_union_8_5_ebd6940d_for_ProcessedToken_1 *)
                 std::__shared_ptr_access<Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x41ef5b);
        *paVar7 = in_stack_ffffffffffffff20;
      }
      else {
        lpassert(SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0));
      }
      std::vector<std::shared_ptr<Constraint>,_std::allocator<std::shared_ptr<Constraint>_>_>::
      push_back((vector<std::shared_ptr<Constraint>,_std::allocator<std::shared_ptr<Constraint>_>_>
                 *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      __gnu_cxx::
      __normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
      ::operator++((__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>
                    *)local_40._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::shared_ptr<Constraint>::~shared_ptr((shared_ptr<Constraint> *)0x41efa7);
    }
  }
  return;
}

Assistant:

void Reader::processconsec() {
  if (!sectiontokens.count(LpSectionKeyword::CON)) return;
  std::vector<ProcessedToken>::iterator& begin(
      sectiontokens[LpSectionKeyword::CON].first);
  std::vector<ProcessedToken>::iterator& end(
      sectiontokens[LpSectionKeyword::CON].second);
  while (begin != end) {
    std::shared_ptr<Constraint> con =
        std::shared_ptr<Constraint>(new Constraint);
    parseexpression(begin, end, con->expr, false);
    // should not be at end of section yet, but a comparison operator should be
    // next
    lpassert(begin != sectiontokens[LpSectionKeyword::CON].second);
    lpassert(begin->type == ProcessedTokenType::COMP);
    LpComparisonType dir = begin->dir;
    ++begin;

    // should still not be at end of section yet, but a right-hand-side value
    // should be next
    lpassert(begin != sectiontokens[LpSectionKeyword::CON].second);
    lpassert(begin->type == ProcessedTokenType::CONST);
    switch (dir) {
      case LpComparisonType::EQ:
        con->lowerbound = con->upperbound = begin->value;
        break;
      case LpComparisonType::LEQ:
        con->upperbound = begin->value;
        break;
      case LpComparisonType::GEQ:
        con->lowerbound = begin->value;
        break;
      default:
        lpassert(false);
    }
    builder.model.constraints.push_back(con);
    ++begin;
  }
}